

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRGenerator.cc
# Opt level: O2

int __thiscall
flow::lang::IRGenerator::accept(IRGenerator *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  IRBuilder *this_00;
  int extraout_EAX;
  BasicBlock *trueBlock;
  BasicBlock *falseBlock;
  BasicBlock *target;
  undefined4 in_register_00000034;
  long lVar1;
  allocator<char> local_51;
  string local_50;
  
  lVar1 = CONCAT44(in_register_00000034,__fd);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"trueBlock",&local_51);
  this_00 = &this->super_IRBuilder;
  trueBlock = IRBuilder::createBlock(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"falseBlock",&local_51);
  falseBlock = IRBuilder::createBlock(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"contBlock",&local_51);
  target = IRBuilder::createBlock(this_00,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  (**(code **)(**(long **)(lVar1 + 0x40) + 0x10))(*(long **)(lVar1 + 0x40),this);
  IRBuilder::createCondBr(this_00,this->result_,trueBlock,falseBlock);
  IRBuilder::setInsertPoint(this_00,trueBlock);
  codegen(this,*(Stmt **)(lVar1 + 0x48));
  IRBuilder::createBr(this_00,target);
  IRBuilder::setInsertPoint(this_00,falseBlock);
  codegen(this,*(Stmt **)(lVar1 + 0x50));
  IRBuilder::createBr(this_00,target);
  IRBuilder::setInsertPoint(this_00,target);
  return extraout_EAX;
}

Assistant:

void IRGenerator::accept(CondStmt& condStmt) {
  BasicBlock* trueBlock = createBlock("trueBlock");
  BasicBlock* falseBlock = createBlock("falseBlock");
  BasicBlock* contBlock = createBlock("contBlock");

  Value* cond = codegen(condStmt.condition());
  createCondBr(cond, trueBlock, falseBlock);

  setInsertPoint(trueBlock);
  codegen(condStmt.thenStmt());
  createBr(contBlock);

  setInsertPoint(falseBlock);
  codegen(condStmt.elseStmt());
  createBr(contBlock);

  setInsertPoint(contBlock);
}